

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_mgr.cxx
# Opt level: O2

int __thiscall
nuraft::nuraft_global_mgr::worker_handle::shutdown(worker_handle *this,int __fd,int __how)

{
  element_type *peVar1;
  int extraout_EAX;
  
  LOCK();
  (this->stopping_)._M_base._M_i = true;
  UNLOCK();
  peVar1 = (this->thread_).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    if ((peVar1->_M_id)._M_thread != 0) {
      EventAwaiter::invoke(&this->ea_);
      std::thread::join();
    }
    std::__shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->thread_).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>);
    return extraout_EAX;
  }
  return 0;
}

Assistant:

void shutdown() {
        stopping_ = true;
        if (thread_) {
            if (thread_->joinable()) {
                ea_.invoke();
                thread_->join();
            }
            thread_.reset();
        }
    }